

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::RadioEntityType::operator==(RadioEntityType *this,RadioEntityType *Value)

{
  RadioEntityType *Value_local;
  RadioEntityType *this_local;
  
  if (this->m_ui8EntityKind == Value->m_ui8EntityKind) {
    if (this->m_ui8Domain == Value->m_ui8Domain) {
      if (this->m_ui16Country == Value->m_ui16Country) {
        if (this->m_ui8Category == Value->m_ui8Category) {
          if (this->m_ui8NomenclatureVersion == Value->m_ui8NomenclatureVersion) {
            if (this->m_ui16Nomenclature == Value->m_ui16Nomenclature) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL RadioEntityType::operator == ( const RadioEntityType & Value ) const
{
    if( m_ui8EntityKind           != Value.m_ui8EntityKind )          return false;
    if( m_ui8Domain               != Value.m_ui8Domain )              return false;
    if( m_ui16Country             != Value.m_ui16Country )            return false;
    if( m_ui8Category             != Value.m_ui8Category )            return false;
    if( m_ui8NomenclatureVersion  != Value.m_ui8NomenclatureVersion ) return false;
    if( m_ui16Nomenclature        != Value.m_ui16Nomenclature )       return false;
    return true;
}